

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Int_t * Gia_SimCollectBest(Vec_Flt_t *vQuo)

{
  float fVar1;
  uint uVar2;
  Vec_Int_t *p;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  
  uVar2 = vQuo->nSize;
  fVar6 = 0.0;
  if ((ulong)uVar2 != 0) {
    fVar6 = *vQuo->pArray;
    if (1 < (int)uVar2) {
      uVar4 = 1;
      do {
        fVar1 = vQuo->pArray[uVar4];
        if (fVar1 <= fVar6) {
          fVar1 = fVar6;
        }
        fVar6 = fVar1;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  if (fVar6 <= 0.0) {
    p = (Vec_Int_t *)0x0;
  }
  else {
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 100;
    p->nSize = 0;
    piVar3 = (int *)malloc(400);
    p->pArray = piVar3;
    if (0 < vQuo->nSize) {
      lVar5 = 0;
      do {
        if ((vQuo->pArray[lVar5] == fVar6) && (!NAN(vQuo->pArray[lVar5]) && !NAN(fVar6))) {
          Vec_IntPush(p,(int)lVar5);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < vQuo->nSize);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_SimCollectBest( Vec_Flt_t * vQuo )
{
    Vec_Int_t * vRes; int i;
    float Value, ValueMax = Vec_FltFindMax( vQuo );
    if ( ValueMax <= 0 )
        return NULL;
    vRes = Vec_IntAlloc( 100 );  // variables with max quo
    Vec_FltForEachEntry( vQuo, Value, i )
        if ( Value == ValueMax )
            Vec_IntPush( vRes, i );
    return vRes;
}